

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall soul::StructuralParser::createLiteral(StructuralParser *this,Value *v)

{
  Constant *expression;
  Expression *pEVar1;
  Context local_30;
  
  getContext(&local_30,this);
  expression = allocate<soul::AST::Constant,soul::AST::Context,soul::Value&>(this,&local_30,v);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_30);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::skip(&this->super_SOULTokeniser);
  pEVar1 = parseSuffixes(this,&expression->super_Expression);
  return pEVar1;
}

Assistant:

AST::Expression& createLiteral (Value v)
    {
        auto& lit = allocate<AST::Constant> (getContext(), v);
        skip();
        return parseSuffixes (lit);
    }